

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.h
# Opt level: O3

ImageList * __thiscall aeron::Subscription::removeAndCloseAllImages(Subscription *this)

{
  ImageList *pIVar1;
  long lVar2;
  size_t sVar3;
  __pointer_type pIVar4;
  undefined8 *puVar5;
  uint8_t **ppuVar6;
  
  pIVar1 = (this->m_imageList)._M_b._M_p;
  sVar3 = pIVar1->m_length;
  if (sVar3 != 0) {
    ppuVar6 = &(pIVar1->m_images->m_subscriberPosition).
               super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.
               m_buffer.m_buffer;
    do {
      if ((*(byte *)(ppuVar6 + 9) & 1) == 0) {
        lVar2 = *(long *)(*ppuVar6 + *(int *)((long)ppuVar6 + 0x14));
        ppuVar6[0x11] = (uint8_t *)lVar2;
        *(bool *)((long)ppuVar6 + 0x9c) =
             *(long *)(*(long *)((long)ppuVar6[3] + 0x68) + 0x80) <= lVar2;
        *(undefined1 *)(ppuVar6 + 9) = 1;
      }
      ppuVar6 = ppuVar6 + 0x25;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  pIVar4 = (__pointer_type)operator_new(0x10);
  puVar5 = (undefined8 *)operator_new__(8);
  *puVar5 = 0;
  pIVar4->m_images = (Image *)(puVar5 + 1);
  pIVar4->m_length = 0;
  (this->m_imageList)._M_b._M_p = pIVar4;
  (this->m_isClosed)._M_base._M_i = true;
  return pIVar1;
}

Assistant:

struct ImageList *removeAndCloseAllImages()
    {
        struct ImageList *oldImageList = std::atomic_load_explicit(&m_imageList, std::memory_order_acquire);
        Image *oldArray = oldImageList->m_images;
        std::size_t length = oldImageList->m_length;

        for (std::size_t i = 0; i < length; i++)
        {
            oldArray[i].close();
        }

        auto newImageList = new struct ImageList(new Image[0], 0);

        std::atomic_store_explicit(&m_imageList, newImageList, std::memory_order_release);
        std::atomic_store_explicit(&m_isClosed, true, std::memory_order_release);

        return oldImageList;
    }